

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O0

bool_t gf2Create(qr_o *f,size_t *p,void *stack)

{
  ulong *puVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  code *pcVar6;
  ulong *in_RSI;
  long *in_RDI;
  size_t n1_1;
  gf2_pentanom_st *t_1;
  size_t n1;
  gf2_trinom_st *t;
  size_t in_stack_ffffffffffffff80;
  
  if (in_RSI[1] == 0) {
    return 0;
  }
  if (in_RSI[2] == 0) {
    if (in_RSI[3] != 0) {
      return 0;
    }
    if ((((*in_RSI & 7) == 0) || (*in_RSI <= in_RSI[1])) || (*in_RSI - in_RSI[1] < 0x40)) {
      return 0;
    }
    in_RDI[6] = *in_RSI + 0x3f >> 6;
    sVar2 = in_RDI[6] + (long)(int)(uint)((*in_RSI & 0x3f) == 0);
    in_RDI[7] = *in_RSI + 7 >> 3;
    in_RDI[3] = (long)(in_RDI + 0x12);
    wwSetZero((word *)in_RDI[3],sVar2);
    wwSetBit((word *)in_RDI[3],*in_RSI,1);
    wwSetBit((word *)in_RDI[3],in_RSI[1],1);
    wwSetBit((word *)in_RDI[3],0,1);
    in_RDI[4] = in_RDI[3] + sVar2 * 8;
    wwSetW((word *)in_RDI[4],in_RDI[6],1);
    in_RDI[5] = in_RDI[4] + in_RDI[6] * 8;
    puVar1 = (ulong *)in_RDI[5];
    *puVar1 = *in_RSI;
    puVar1[1] = in_RSI[1];
    puVar1[3] = 0;
    puVar1[2] = 0;
    puVar1[4] = *in_RSI & 0x3f;
    puVar1[5] = *in_RSI >> 6;
    puVar1[6] = *in_RSI - in_RSI[1] & 0x3f;
    puVar1[7] = *in_RSI - in_RSI[1] >> 6;
    in_RDI[8] = (long)gf2From;
    in_RDI[9] = (long)gf2To;
    in_RDI[10] = (long)gf2Add3;
    in_RDI[0xb] = (long)gf2Add3;
    in_RDI[0xc] = (long)gf2Neg2;
    pcVar6 = gf2MulTrinomial1;
    if (puVar1[6] == 0) {
      pcVar6 = gf2MulTrinomial0;
    }
    in_RDI[0xd] = (long)pcVar6;
    pcVar6 = gf2SqrTrinomial1;
    if (puVar1[6] == 0) {
      pcVar6 = gf2SqrTrinomial0;
    }
    in_RDI[0xe] = (long)pcVar6;
    in_RDI[0xf] = (long)gf2Inv;
    in_RDI[0x10] = (long)gf2Div;
    *in_RDI = (sVar2 + in_RDI[6]) * 8 + 0xd0;
    in_RDI[1] = 3;
    in_RDI[2] = 0;
    if (puVar1[6] == 0) {
      sVar2 = gf2MulTrinomial0_deep(0x176e9b);
      sVar3 = gf2SqrTrinomial0_deep(0x176eae);
      sVar4 = gf2Inv_deep(in_stack_ffffffffffffff80);
      sVar5 = gf2Div_deep(in_stack_ffffffffffffff80);
      sVar2 = utilMax(4,sVar2,sVar3,sVar4,sVar5);
      in_RDI[0x11] = sVar2;
    }
    else {
      sVar2 = gf2MulTrinomial1_deep(0x176f11);
      sVar3 = gf2SqrTrinomial1_deep(0x176f24);
      sVar4 = gf2Inv_deep(in_stack_ffffffffffffff80);
      sVar5 = gf2Div_deep(in_stack_ffffffffffffff80);
      sVar2 = utilMax(4,sVar2,sVar3,sVar4,sVar5);
      in_RDI[0x11] = sVar2;
    }
  }
  else {
    if (in_RSI[3] == 0) {
      return 0;
    }
    if ((((*in_RSI <= in_RSI[1]) || (in_RSI[1] <= in_RSI[2])) || (in_RSI[2] <= in_RSI[3])) ||
       ((*in_RSI - in_RSI[1] < 0x40 || (0x3f < in_RSI[1])))) {
      return 0;
    }
    in_RDI[6] = *in_RSI + 0x3f >> 6;
    sVar2 = in_RDI[6] + (long)(int)(uint)((*in_RSI & 0x3f) == 0);
    in_RDI[7] = *in_RSI + 7 >> 3;
    in_RDI[3] = (long)(in_RDI + 0x12);
    wwSetZero((word *)in_RDI[3],sVar2);
    wwSetBit((word *)in_RDI[3],*in_RSI,1);
    wwSetBit((word *)in_RDI[3],in_RSI[1],1);
    wwSetBit((word *)in_RDI[3],in_RSI[2],1);
    wwSetBit((word *)in_RDI[3],in_RSI[3],1);
    wwSetBit((word *)in_RDI[3],0,1);
    in_RDI[4] = in_RDI[3] + sVar2 * 8;
    wwSetW((word *)in_RDI[4],in_RDI[6],1);
    in_RDI[5] = in_RDI[4] + in_RDI[6] * 8;
    puVar1 = (ulong *)in_RDI[5];
    *puVar1 = *in_RSI;
    puVar1[1] = in_RSI[1];
    puVar1[2] = in_RSI[2];
    puVar1[3] = in_RSI[3];
    puVar1[4] = *in_RSI & 0x3f;
    puVar1[5] = *in_RSI >> 6;
    puVar1[6] = *in_RSI - in_RSI[1] & 0x3f;
    puVar1[7] = *in_RSI - in_RSI[1] >> 6;
    puVar1[8] = *in_RSI - in_RSI[2] & 0x3f;
    puVar1[9] = *in_RSI - in_RSI[2] >> 6;
    puVar1[10] = *in_RSI - in_RSI[3] & 0x3f;
    puVar1[0xb] = *in_RSI - in_RSI[3] >> 6;
    in_RDI[8] = (long)gf2From;
    in_RDI[9] = (long)gf2To;
    in_RDI[10] = (long)gf2Add3;
    in_RDI[0xb] = (long)gf2Add3;
    in_RDI[0xc] = (long)gf2Neg2;
    in_RDI[0xd] = (long)gf2MulPentanomial;
    in_RDI[0xe] = (long)gf2SqrPentanomial;
    in_RDI[0xf] = (long)gf2Inv;
    in_RDI[0x10] = (long)gf2Div;
    *in_RDI = (sVar2 + in_RDI[6]) * 8 + 0xf0;
    in_RDI[1] = 3;
    in_RDI[2] = 0;
    sVar2 = gf2MulPentanomial_deep(0x177385);
    sVar3 = gf2SqrPentanomial_deep(0x177397);
    sVar4 = gf2Inv_deep(sVar3);
    sVar5 = gf2Div_deep(sVar3);
    sVar2 = utilMax(4,sVar2,sVar3,sVar4,sVar5);
    in_RDI[0x11] = sVar2;
  }
  return 1;
}

Assistant:

bool_t gf2Create(qr_o* f, const size_t p[4], void* stack)
{
	ASSERT(memIsValid(f, sizeof(qr_o)));
	ASSERT(memIsValid(p, 4 * sizeof(size_t)));
	// нормальный базис?
	if (p[1] == 0)
	{
		// todo: реализовать
		return FALSE;
	}
	// трехчлен?
	else if (p[2] == 0)
	{
		gf2_trinom_st* t;
		size_t n1;
		// нарушены соглашения?
		if (p[3] != 0)
			return FALSE;
		// нарушены условия функции ppRedTrinomial?
		if (p[0] % 8 == 0 || p[1] >= p[0] || p[0] - p[1] < B_PER_W)
			return FALSE;
		// зафиксировать размерность
		f->n = W_OF_B(p[0]);
		n1 = f->n + (p[0] % B_PER_W == 0);
		f->no = O_OF_B(p[0]);
		// сформировать mod
		f->mod = (word*)f->descr;
		wwSetZero(f->mod, n1);
		wwSetBit(f->mod, p[0], 1);
		wwSetBit(f->mod, p[1], 1);
		wwSetBit(f->mod, 0, 1);
		// сформировать unity
		f->unity = f->mod + n1;
		wwSetW(f->unity, f->n, 1);
		// сформировать params
		f->params = (size_t*)(f->unity + f->n);
		t = (gf2_trinom_st*)f->params;
		t->m = p[0];
		t->k = p[1];
		t->l = t->l1 = 0;
		t->bm = p[0] % B_PER_W;
		t->wm = p[0] / B_PER_W;
		t->bk = (p[0] - p[1]) % B_PER_W;
		t->wk = (p[0] - p[1]) / B_PER_W;
		// настроить интерфейсы
		f->from = gf2From;
		f->to = gf2To;
		f->add = gf2Add3;
		f->sub = gf2Add3;
		f->neg = gf2Neg2;
		f->mul = t->bk == 0 ? gf2MulTrinomial0 : gf2MulTrinomial1;
		f->sqr = t->bk == 0 ? gf2SqrTrinomial0 : gf2SqrTrinomial1;
		f->inv = gf2Inv;
		f->div = gf2Div;
		// заголовок
		f->hdr.keep = sizeof(qr_o) + O_OF_W(n1 + f->n) + sizeof(gf2_trinom_st);
		f->hdr.p_count = 3;
		f->hdr.o_count = 0;
		// глубина стека
		if (t->bk == 0)
			f->deep = utilMax(4,
				gf2MulTrinomial0_deep(f->n),
				gf2SqrTrinomial0_deep(f->n),
				gf2Inv_deep(f->n),
				gf2Div_deep(f->n));
		else 
			f->deep = utilMax(4,
				gf2MulTrinomial1_deep(f->n),
				gf2SqrTrinomial1_deep(f->n),
				gf2Inv_deep(f->n),
				gf2Div_deep(f->n));
	}
	// пятичлен?
	else
	{
		gf2_pentanom_st* t;
		size_t n1;
		// нарушены соглашения?
		if (p[3] == 0)
			return FALSE;
		// нарушены условия функции ppRedPentanomial?
		if (p[1] >= p[0] || p[2] >= p[1] || p[3] >= p[2] || 
			p[0] - p[1] < B_PER_W || p[1] >= B_PER_W)
			return FALSE;
		// зафиксировать размерность
		f->n = W_OF_B(p[0]);
		n1 = f->n + (p[0] % B_PER_W == 0);
		f->no = O_OF_B(p[0]);
		// сформировать mod
		f->mod = (word*)f->descr;
		wwSetZero(f->mod, n1);
		wwSetBit(f->mod, p[0], 1);
		wwSetBit(f->mod, p[1], 1);
		wwSetBit(f->mod, p[2], 1);
		wwSetBit(f->mod, p[3], 1);
		wwSetBit(f->mod, 0, 1);
		// сформировать unity
		f->unity = f->mod + n1;
		wwSetW(f->unity, f->n, 1);
		// сформировать params
		f->params = (size_t*)(f->unity + f->n);
		t = (gf2_pentanom_st*)f->params;
		t->m = p[0];
		t->k = p[1];
		t->l = p[2];
		t->l1 = p[3];
		t->bm = p[0] % B_PER_W;
		t->wm = p[0] / B_PER_W;
		t->bk = (p[0] - p[1]) % B_PER_W;
		t->wk = (p[0] - p[1]) / B_PER_W;
		t->bl = (p[0] - p[2]) % B_PER_W;
		t->wl = (p[0] - p[2]) / B_PER_W;
		t->bl1 = (p[0] - p[3]) % B_PER_W;
		t->wl1 = (p[0] - p[3]) / B_PER_W;
		// настроить интерфейсы
		f->from = gf2From;
		f->to = gf2To;
		f->add = gf2Add3;
		f->sub = gf2Add3;
		f->neg = gf2Neg2;
		f->mul = gf2MulPentanomial;
		f->sqr = gf2SqrPentanomial;
		f->inv = gf2Inv;
		f->div = gf2Div;
		// заголовок
		f->hdr.keep = sizeof(qr_o) + O_OF_W(n1 + f->n) + 
			sizeof(gf2_pentanom_st);
		f->hdr.p_count = 3;
		f->hdr.o_count = 0;
		// глубина стека
		f->deep = utilMax(4,
			gf2MulPentanomial_deep(f->n),
			gf2SqrPentanomial_deep(f->n),
			gf2Inv_deep(f->n),
			gf2Div_deep(f->n));
	}
	return TRUE;
}